

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

void henson::Serialization<henson::Scheduler::Job>::save(BinaryBuffer *bb,Job *j)

{
  BinaryBuffer *in_RSI;
  MemoryBuffer *in_stack_ffffffffffffffe8;
  
  save<unsigned_long>(in_RSI,(unsigned_long *)in_stack_ffffffffffffffe8);
  save<std::__cxx11::string>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffe8);
  save<std::__cxx11::string>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffe8);
  save<henson::MemoryBuffer>(in_RSI,in_stack_ffffffffffffffe8);
  save<std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>
            (in_RSI,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_ffffffffffffffe8);
  save<unsigned_long>(in_RSI,(unsigned_long *)in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Scheduler::Job& j)
    {
        henson::save(bb, j.id);
        henson::save(bb, j.name);
        henson::save(bb, j.function);
        henson::save(bb, j.arg);
        henson::save(bb, j.groups);
        henson::save(bb, j.size);
    }